

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O0

sexp sexp_identifier_eq_op(sexp ctx,sexp self,sexp_sint_t n,sexp e1,sexp id1,sexp e2,sexp id2)

{
  sexp ctx_00;
  sexp psVar1;
  int *in_RCX;
  sexp in_R8;
  sexp in_R9;
  bool bVar2;
  sexp in_stack_00000008;
  sexp cell2;
  sexp cell1;
  int in_stack_ffffffffffffffac;
  undefined6 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb6;
  undefined1 in_stack_ffffffffffffffb7;
  sexp in_stack_ffffffffffffffb8;
  sexp in_stack_ffffffffffffffc0;
  sexp local_8;
  
  if ((((ulong)in_RCX & 3) == 0) && (*in_RCX == 0x17)) {
    if ((((ulong)in_R9 & 3) == 0) && (in_R9->tag == 0x17)) {
      ctx_00 = sexp_env_cell(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                             (sexp)CONCAT17(in_stack_ffffffffffffffb7,
                                            CONCAT16(in_stack_ffffffffffffffb6,
                                                     in_stack_ffffffffffffffb0)),
                             in_stack_ffffffffffffffac);
      psVar1 = sexp_env_cell(ctx_00,in_stack_ffffffffffffffb8,
                             (sexp)CONCAT17(in_stack_ffffffffffffffb7,
                                            CONCAT16(in_stack_ffffffffffffffb6,
                                                     in_stack_ffffffffffffffb0)),
                             in_stack_ffffffffffffffac);
      if ((ctx_00 == (sexp)0x0) || (ctx_00 != psVar1)) {
        if ((ctx_00 == (sexp)0x0) && ((psVar1 == (sexp)0x0 && (in_R8 == in_stack_00000008)))) {
          local_8 = (sexp)&DAT_0000013e;
        }
        else {
          while( true ) {
            bVar2 = false;
            if (((ulong)in_R8 & 3) == 0) {
              bVar2 = in_R8->tag == 0x16;
            }
            if (!bVar2) break;
            in_R8 = (in_R8->value).type.slots;
          }
          while( true ) {
            bVar2 = false;
            if (((ulong)in_stack_00000008 & 3) == 0) {
              bVar2 = in_stack_00000008->tag == 0x16;
            }
            if (!bVar2) break;
            in_stack_00000008 = (in_stack_00000008->value).type.slots;
          }
          if (((in_R8 == in_stack_00000008) && (ctx_00 == (sexp)0x0)) && (psVar1 == (sexp)0x0)) {
            local_8 = (sexp)&DAT_0000013e;
          }
          else {
            local_8 = (sexp)&DAT_0000003e;
          }
        }
      }
      else {
        local_8 = (sexp)&DAT_0000013e;
      }
    }
    else {
      local_8 = sexp_type_exception(in_R8,in_R9,(sexp_uint_t)in_stack_ffffffffffffffc0,
                                    in_stack_ffffffffffffffb8);
    }
  }
  else {
    local_8 = sexp_type_exception(in_R8,in_R9,(sexp_uint_t)in_stack_ffffffffffffffc0,
                                  in_stack_ffffffffffffffb8);
  }
  return local_8;
}

Assistant:

sexp sexp_identifier_eq_op (sexp ctx, sexp self, sexp_sint_t n, sexp e1, sexp id1, sexp e2, sexp id2) {
  sexp cell1, cell2;
  sexp_assert_type(ctx, sexp_envp, SEXP_ENV, e1);
  sexp_assert_type(ctx, sexp_envp, SEXP_ENV, e2);
  cell1 = sexp_env_cell(ctx, e1, id1, 0);
  cell2 = sexp_env_cell(ctx, e2, id2, 0);
  if (cell1 && (cell1 == cell2))
    return SEXP_TRUE;
  else if (!cell1 && !cell2 && (id1 == id2))
    return SEXP_TRUE;
  /* If the symbols are the same and the cells are either unbound or
   * (optionally) bound to top-level variables, consider them the
   * same.  Local (non-toplevel) bindings must still match exactly.
   */
  while (sexp_synclop(id1))
    id1 = sexp_synclo_expr(id1);
  while (sexp_synclop(id2))
    id2 = sexp_synclo_expr(id2);
  if ((id1 == id2)
      && ((!cell1 && !cell2)
#if !SEXP_USE_STRICT_TOPLEVEL_BINDINGS
          || ((!cell1 || (!sexp_lambdap(sexp_cdr(cell1)) &&
                         !sexp_env_cell_syntactic_p(cell1))) &&
              (!cell2 || (!sexp_lambdap(sexp_cdr(cell2)) &&
                          !sexp_env_cell_syntactic_p(cell2))))
#endif
              ))
    return SEXP_TRUE;
  return SEXP_FALSE;
}